

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O3

bool __thiscall
MeCab::RewritePattern::rewrite(RewritePattern *this,size_t size,char **input,string *output)

{
  char *pcVar1;
  char *__s2;
  int iVar2;
  size_t sVar3;
  undefined8 *puVar4;
  ostream *poVar5;
  ulong uVar6;
  pointer pbVar7;
  char *pcVar8;
  undefined8 *puVar9;
  byte *pbVar10;
  byte *pbVar11;
  char cVar12;
  char *__s;
  long lVar13;
  long lVar14;
  char *pcVar15;
  pointer pbVar16;
  ulong uVar17;
  bool bVar18;
  string elm;
  die local_81;
  char *local_80;
  RewritePattern *local_78;
  string *local_70;
  size_t local_68;
  string local_60;
  char **local_40;
  size_t local_38;
  
  pbVar7 = (this->spat_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar16 = (this->spat_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (size < (ulong)((long)pbVar16 - (long)pbVar7 >> 5)) {
LAB_00162a2a:
    bVar18 = false;
  }
  else {
    local_78 = this;
    local_70 = output;
    local_40 = input;
    local_38 = size;
    if (pbVar16 != pbVar7) {
      uVar17 = 0;
      do {
        pcVar1 = pbVar7[uVar17]._M_dataplus._M_p;
        cVar12 = *pcVar1;
        if (cVar12 != '*') {
          __s2 = local_40[uVar17];
          iVar2 = strcmp(pcVar1,__s2);
          if (iVar2 != 0) {
            sVar3 = strlen(pcVar1);
            if (cVar12 != '(') {
              return false;
            }
            if (sVar3 < 3) {
              return false;
            }
            if (pcVar1[sVar3 - 1] != ')') goto LAB_00162a2a;
            local_80 = (char *)operator_new__(0x2000);
            puVar4 = (undefined8 *)operator_new__(0x10000);
            local_68 = sVar3;
            if (0x1ffc < sVar3) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                         ,0x79);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2e);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"len < buf.size() - 3",0x14)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"too long parameter",0x12);
              die::~die((die *)&local_60);
            }
            __s = local_80;
            strncpy(local_80,pcVar1 + 1,0x2000);
            __s[local_68 - 2] = '\0';
            sVar3 = strlen(__s);
            pcVar8 = __s + sVar3;
            uVar6 = 0;
            pcVar1 = pcVar8;
            pcVar15 = __s;
            puVar9 = puVar4;
            do {
              while( true ) {
                if (__s == pcVar8) {
                  *pcVar8 = '\0';
                  *puVar9 = pcVar1;
                  lVar14 = uVar6 + 1;
                  if (0x1ffe < uVar6) goto LAB_00162bf0;
                  goto LAB_00162c8e;
                }
                if (*__s == '|') break;
                __s = __s + 1;
                pcVar1 = pcVar15;
              }
              *__s = '\0';
              *puVar9 = pcVar15;
              puVar9 = (undefined8 *)((long)puVar9 + 8);
              uVar6 = uVar6 + 1;
              __s = __s + 1;
              pcVar1 = pcVar8;
              pcVar15 = __s;
            } while (uVar6 != 0x2000);
            lVar14 = 0x2000;
LAB_00162bf0:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                       ,0x79);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x32);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,") [",3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"n < col.size()",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"too long OR nodes",0x11);
            die::~die((die *)&local_60);
LAB_00162c8e:
            lVar13 = 0;
            do {
              iVar2 = strcmp(__s2,(char *)puVar4[lVar13]);
              if (iVar2 == 0) break;
              bVar18 = lVar14 + -1 != lVar13;
              lVar13 = lVar13 + 1;
            } while (bVar18);
            operator_delete__(puVar4);
            operator_delete__(local_80);
            if (iVar2 != 0) goto LAB_00162a2a;
            pbVar7 = (local_78->spat_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pbVar16 = (local_78->spat_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < (ulong)((long)pbVar16 - (long)pbVar7 >> 5));
    }
    local_70->_M_string_length = 0;
    *(local_70->_M_dataplus)._M_p = '\0';
    pbVar7 = (local_78->dpat_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((local_78->dpat_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
      uVar17 = 0;
      do {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        local_60._M_string_length = 0;
        local_60.field_2._M_local_buf[0] = '\0';
        local_80 = (char *)(uVar17 * 0x20);
        local_68 = uVar17;
        if (0 < (long)pbVar7[uVar17]._M_string_length) {
          pbVar10 = (byte *)pbVar7[uVar17]._M_dataplus._M_p;
          pbVar11 = pbVar10 + pbVar7[uVar17]._M_string_length;
          do {
            cVar12 = (char)&local_60;
            if (*pbVar10 == 0x24) {
              pbVar10 = pbVar10 + 1;
              lVar14 = 0;
              if (pbVar10 < pbVar11) {
                do {
                  bVar18 = (byte)(*pbVar10 - 0x3a) < 0xf6;
                  if (bVar18) break;
                  lVar14 = (ulong)*pbVar10 + lVar14 * 10 + -0x30;
                  pbVar10 = pbVar10 + 1;
                } while (pbVar10 < pbVar11);
              }
              else {
                bVar18 = false;
              }
              if (local_38 <= lVar14 - 1U) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                           ,0x79);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x69);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,") [",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar5,"n > 0 && (n - 1) < size",0x17);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5," out of range: [",0x10);
                pbVar7 = (local_78->dpat_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar5,*(char **)((long)&(pbVar7->_M_dataplus)._M_p +
                                                     (long)local_80),
                                    *(long *)((long)&pbVar7->_M_string_length + (long)local_80));
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                die::~die(&local_81);
              }
              std::__cxx11::string::append((char *)&local_60);
              if (bVar18) {
                std::__cxx11::string::push_back(cVar12);
              }
            }
            else {
              std::__cxx11::string::push_back(cVar12);
            }
            pbVar10 = pbVar10 + 1;
          } while (pbVar10 < pbVar11);
        }
        bVar18 = escape_csv_element(&local_60);
        sVar3 = local_68;
        if (!bVar18) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                     ,0x79);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x71);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"escape_csv_element(&elm)",0x18)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
          die::~die(&local_81);
        }
        std::__cxx11::string::_M_append((char *)local_70,(ulong)local_60._M_dataplus._M_p);
        uVar17 = sVar3 + 1;
        if (uVar17 != (long)(local_78->dpat_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_78->dpat_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) {
          std::__cxx11::string::append((char *)local_70);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        pbVar7 = (local_78->dpat_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar17 < (ulong)((long)(local_78->dpat_).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5
                               ));
    }
    bVar18 = true;
  }
  return bVar18;
}

Assistant:

bool RewritePattern::rewrite(size_t size,
                             const char **input,
                             std::string *output) const {
  if (spat_.size() > size) return false;
  for (size_t i = 0; i < spat_.size(); ++i) {
    if (!match_rewrite_pattern(spat_[i].c_str(), input[i]))
      return false;
  }

  output->clear();
  for (size_t i = 0; i < dpat_.size(); ++i) {
    std::string elm;
    const char *begin = dpat_[i].c_str();
    const char *end = begin + dpat_[i].size();
    for (const char *p = begin; p < end; ++p) {
      if (*p == '$') {
        ++p;
        size_t n = 0;
        for (; p < end; ++p) {
          switch (*p) {
            case '0': case '1': case '2': case '3': case '4':
            case '5': case '6': case '7': case '8': case '9':
              n = 10 * n + (*p - '0');
              break;
            default:
              goto NEXT;
          }
        }
     NEXT:
        CHECK_DIE(n > 0 && (n - 1) < size)
            << " out of range: [" << dpat_[i] << "] " << n;
        elm += input[n - 1];
        if (p < end) elm += *p;
      } else {
        elm += *p;
      }
    }
    CHECK_DIE(escape_csv_element(&elm));
    *output += elm;
    if (i + 1 != dpat_.size()) *output += ",";
  }

  return true;
}